

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

void __thiscall Analyser::addRet(Analyser *this)

{
  Instruction local_20;
  
  if (this->_currentFunctionRetType == 'i') {
    local_20._opr = ipush;
    local_20._x = 0;
    local_20._y = 0;
    local_20._paramNum = 1;
    addInstruction(this,&local_20);
    local_20._opr = iret;
    local_20._x = 0;
  }
  else {
    local_20._opr = ret;
    local_20._x = 0;
  }
  local_20._y = 0;
  local_20._paramNum = 0;
  addInstruction(this,&local_20);
  return;
}

Assistant:

void Analyser::addRet()
{
	//������
	if (_currentFunctionRetType == 'i') {
		addInstruction(Instruction(Operation::ipush, 0));
		addInstruction(Instruction(Operation::iret));
	}
	else {
		addInstruction(Instruction(Operation::ret));
	}
}